

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnection.cpp
# Opt level: O2

void __thiscall
FIX::SocketConnection::readMessages(SocketConnection *this,SocketMonitor *socketMonitor)

{
  Session *this_00;
  bool bVar1;
  string message;
  string local_60;
  UtcTimeStamp local_40;
  
  if (this->m_pSession != (Session *)0x0) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    while( true ) {
      bVar1 = readMessage(this,&local_60);
      if (!bVar1) break;
      this_00 = this->m_pSession;
      UtcTimeStamp::now();
      Session::next(this_00,&local_60,&local_40,false);
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void SocketConnection::readMessages(SocketMonitor &socketMonitor) {
  if (!m_pSession) {
    return;
  }

  std::string message;
  while (readMessage(message)) {
    try {
      m_pSession->next(message, UtcTimeStamp::now());
    } catch (InvalidMessage &) {
      if (!m_pSession->isLoggedOn()) {
        socketMonitor.drop(m_socket);
      }
    }
  }
}